

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_util.hpp
# Opt level: O0

size_t ans_serialize_interp
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *vec,size_t frame_size,
                 uint8_t **out_u8)

{
  value_type vVar1;
  value_type vVar2;
  undefined1 *puVar3;
  size_type sVar4;
  reference pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  size_t sVar6;
  long *in_RDX;
  undefined8 in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  size_t bytes_written;
  uint *in_buf;
  size_t sym;
  vector<unsigned_int,_std::allocator<unsigned_int>_> increasing_freqs;
  uint32_t *out_ptr_u32;
  uint32_t max_sym;
  uint32_t in_stack_ffffffffffffff3c;
  uint8_t **in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff60;
  ulong local_60;
  size_t in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  uint32_t *in_stack_ffffffffffffffc8;
  uint32_t *in_stack_ffffffffffffffd0;
  
  auVar8 = in_ZMM0._0_16_;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  vbyte_encode_u32(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  auVar8 = vcvtusi2sd_avx512f(auVar8,in_RSI);
  dVar7 = log2(auVar8._0_8_);
  puVar3 = (undefined1 *)*in_RDX;
  *in_RDX = (long)(puVar3 + 1);
  *puVar3 = (char)(int)dVar7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x17bf59);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x17bf7f);
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,0);
  vVar1 = *pvVar5;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &stack0xffffffffffffffc0,0);
  *pvVar5 = vVar1;
  for (local_60 = 1; local_60 <= (int)sVar4 - 1; local_60 = local_60 + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffffc0,local_60 - 1);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,local_60);
    vVar2 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &stack0xffffffffffffffc0,local_60);
    *pvVar5 = vVar1 + vVar2 + 1;
  }
  this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x17c05e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  sVar6 = interpolative_internal::encode
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     (size_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDX = sVar6 + *in_RDX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this);
  return sVar6;
}

Assistant:

size_t ans_serialize_interp(
    std::vector<uint32_t>& vec, size_t frame_size, uint8_t*& out_u8)
{
    uint32_t max_sym = vec.size() - 1;
    vbyte_encode_u32(out_u8, max_sym);
    *out_u8++ = log2(frame_size); // must be power of 2
    auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
    std::vector<uint32_t> increasing_freqs(vec.size());
    increasing_freqs[0] = vec[0];
    for (size_t sym = 1; sym <= max_sym; sym++) {
        increasing_freqs[sym] = increasing_freqs[sym - 1] + vec[sym] + 1;
    }
    auto in_buf = increasing_freqs.data();
    auto bytes_written = interpolative_internal::encode(
        out_ptr_u32, in_buf, vec.size(), frame_size + vec.size() + 1);
    out_u8 += bytes_written;
    return bytes_written;
}